

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O0

int __thiscall HevcSpsUnit::scaling_list_data(HevcSpsUnit *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int local_3c;
  int local_2c;
  int scaling_list_delta_coef;
  int i;
  int scaling_list_dc_coef;
  int coefNum;
  int matrixId;
  int sizeId;
  HevcSpsUnit *this_local;
  
  coefNum = 0;
  do {
    if (3 < coefNum) {
      return 0;
    }
    for (scaling_list_dc_coef = 0; scaling_list_dc_coef < 6;
        scaling_list_dc_coef = iVar3 + scaling_list_dc_coef) {
      bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
      if (bVar1) {
        if (1 << ((char)(coefNum << 1) + 4U & 0x1f) < 0x40) {
          local_3c = 1 << ((char)(coefNum << 1) + 4U & 0x1f);
        }
        else {
          local_3c = 0x40;
        }
        if (1 < coefNum) {
          iVar3 = HevcUnit::extractSEGolombCode((HevcUnit *)this);
          if ((iVar3 + 8 < 1) || (0xff < iVar3 + 8)) {
            return 1;
          }
        }
        for (local_2c = 0; local_2c < local_3c; local_2c = local_2c + 1) {
          iVar3 = HevcUnit::extractSEGolombCode((HevcUnit *)this);
          if ((iVar3 < -0x80) || (0x7f < iVar3)) {
            return 1;
          }
        }
      }
      else {
        uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
        if (5 < uVar2) {
          return 1;
        }
      }
      iVar3 = 1;
      if (coefNum == 3) {
        iVar3 = 3;
      }
    }
    coefNum = coefNum + 1;
  } while( true );
}

Assistant:

int HevcSpsUnit::scaling_list_data()
{
    for (int sizeId = 0; sizeId < 4; sizeId++)
    {
        for (int matrixId = 0; matrixId < 6; matrixId += (sizeId == 3) ? 3 : 1)
        {
            if (!m_reader.getBit())
            {
                if (extractUEGolombCode() > 5)  // scaling_list_pred_matrix_id_delta
                    return 1;
            }
            else
            {
                const int coefNum = FFMIN(64, (1 << (4 + (sizeId << 1))));
                if (sizeId > 1)
                {
                    const int scaling_list_dc_coef = extractSEGolombCode() + 8;
                    if (scaling_list_dc_coef < 1 || scaling_list_dc_coef > 255)
                        return 1;
                }
                for (int i = 0; i < coefNum; i++)
                {
                    const int scaling_list_delta_coef = extractSEGolombCode();
                    if (scaling_list_delta_coef < -128 || scaling_list_delta_coef > 127)
                        return 1;
                }
            }
        }
    }
    return 0;
}